

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicDispatchIndirect::CheckBinding
          (BasicDispatchIndirect *this,GLuint expected)

{
  CallLogWrapper *this_00;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLint64 i64;
  GLboolean local_2d;
  float local_2c;
  float local_28;
  GLuint local_24;
  GLuint local_20 [2];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ef,(GLint *)&local_24);
  if ((local_24 == expected) &&
     (glu::CallLogWrapper::glGetInteger64v(this_00,0x90ef,(GLint64 *)local_20),
     local_20[0] == expected)) {
    local_2c = (float)expected;
    glu::CallLogWrapper::glGetFloatv(this_00,0x90ef,&local_28);
    if ((local_28 == local_2c) && (!NAN(local_28) && !NAN(local_2c))) {
      glu::CallLogWrapper::glGetBooleanv(this_00,0x90ef,&local_2d);
      return (bool)local_2d == (expected != 0);
    }
  }
  return false;
}

Assistant:

bool CheckBinding(GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLboolean b;

		GLfloat expectedFloat = static_cast<GLfloat>(expected);

		glGetIntegerv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i);
		if (static_cast<GLuint>(i) != expected)
		{
			return false;
		}
		glGetInteger64v(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i64);
		if (static_cast<GLuint>(i64) != expected)
		{
			return false;
		}
		glGetFloatv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &f);
		if (f != expectedFloat)
		{
			return false;
		}
		glGetBooleanv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &b);
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
		{
			return false;
		}

		return true;
	}